

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O2

TiXmlNode * __thiscall
despot::util::tinyxml::TiXmlNode::Identify(TiXmlNode *this,char *p,TiXmlEncoding encoding)

{
  uchar anyByte;
  bool bVar1;
  int iVar2;
  char *pcVar3;
  TiXmlElement *this_00;
  TiXmlEncoding TVar4;
  
  pcVar3 = TiXmlBase::SkipWhiteSpace(p,encoding);
  if ((pcVar3 != (char *)0x0) && (*pcVar3 == '<')) {
    GetDocument(this);
    pcVar3 = TiXmlBase::SkipWhiteSpace(pcVar3,encoding);
    if ((pcVar3 != (char *)0x0) && (*pcVar3 != '\0')) {
      bVar1 = TiXmlBase::StringEqual(pcVar3,"<?xml",true,encoding);
      if (bVar1) {
        this_00 = (TiXmlElement *)operator_new(0x68);
        TiXmlDeclaration::TiXmlDeclaration((TiXmlDeclaration *)this_00);
      }
      else {
        bVar1 = TiXmlBase::StringEqual(pcVar3,"<!--",false,encoding);
        if (bVar1) {
          this_00 = (TiXmlElement *)operator_new(0x50);
          TiXmlComment::TiXmlComment((TiXmlComment *)this_00);
        }
        else {
          bVar1 = TiXmlBase::StringEqual(pcVar3,"<![CDATA[",false,encoding);
          if (bVar1) {
            this_00 = (TiXmlElement *)operator_new(0x58);
            TiXmlText::TiXmlText((TiXmlText *)this_00,"");
            *(undefined1 *)&(this_00->attributeSet).sentinel.super_TiXmlBase._vptr_TiXmlBase = 1;
          }
          else {
            TVar4 = 0x180db4;
            bVar1 = TiXmlBase::StringEqual(pcVar3,"<!",false,encoding);
            if (bVar1) {
              this_00 = (TiXmlElement *)operator_new(0x50);
              TiXmlUnknown::TiXmlUnknown((TiXmlUnknown *)this_00);
            }
            else {
              anyByte = pcVar3[1];
              iVar2 = TiXmlBase::IsAlpha(anyByte,TVar4);
              if ((anyByte == '_') || (iVar2 != 0)) {
                this_00 = (TiXmlElement *)operator_new(0x90);
                TiXmlElement::TiXmlElement(this_00,"");
              }
              else {
                this_00 = (TiXmlElement *)operator_new(0x50);
                TiXmlUnknown::TiXmlUnknown((TiXmlUnknown *)this_00);
              }
            }
          }
        }
      }
      (this_00->super_TiXmlNode).parent = this;
      return &this_00->super_TiXmlNode;
    }
  }
  return (TiXmlNode *)0x0;
}

Assistant:

TiXmlNode* TiXmlNode::Identify(const char* p, TiXmlEncoding encoding) {
	TiXmlNode* returnNode = 0;

	p = SkipWhiteSpace(p, encoding);
	if (!p || !*p || *p != '<') {
		return 0;
	}

	TiXmlDocument* doc = GetDocument();
	p = SkipWhiteSpace(p, encoding);

	if (!p || !*p) {
		return 0;
	}

	// What is this thing?
	// - Elements start with a letter or underscore, but xml is reserved.
	// - Comments: <!--
	// - Decleration: <?xml
	// - Everthing else is unknown to tinyxml.
	//

	const char* xmlHeader = { "<?xml" };
	const char* commentHeader = { "<!--" };
	const char* dtdHeader = { "<!" };
	const char* cdataHeader = { "<![CDATA[" };

	if (StringEqual(p, xmlHeader, true, encoding)) {
#ifdef DEBUG_PARSER
		TIXML_LOG( "XML parsing Declaration\n" );
#endif
		returnNode = new TiXmlDeclaration();
	} else if (StringEqual(p, commentHeader, false, encoding)) {
#ifdef DEBUG_PARSER
		TIXML_LOG( "XML parsing Comment\n" );
#endif
		returnNode = new TiXmlComment();
	} else if (StringEqual(p, cdataHeader, false, encoding)) {
#ifdef DEBUG_PARSER
		TIXML_LOG( "XML parsing CDATA\n" );
#endif
		TiXmlText* text = new TiXmlText("");
		text->SetCDATA(true);
		returnNode = text;
	} else if (StringEqual(p, dtdHeader, false, encoding)) {
#ifdef DEBUG_PARSER
		TIXML_LOG( "XML parsing Unknown(1)\n" );
#endif
		returnNode = new TiXmlUnknown();
	} else if (IsAlpha(*(p + 1), encoding) || *(p + 1) == '_') {
#ifdef DEBUG_PARSER
		TIXML_LOG( "XML parsing Element\n" );
#endif
		returnNode = new TiXmlElement("");
	} else {
#ifdef DEBUG_PARSER
		TIXML_LOG( "XML parsing Unknown(2)\n" );
#endif
		returnNode = new TiXmlUnknown();
	}

	if (returnNode) {
		// Set the parent, so it can report errors
		returnNode->parent = this;
	} else {
		if (doc)
			doc->SetError(TIXML_ERROR_OUT_OF_MEMORY, 0, 0,
				TIXML_ENCODING_UNKNOWN);
	}
	return returnNode;
}